

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa-sign.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  streambuf *psVar3;
  ulong uVar4;
  char *pcVar5;
  undefined8 uVar6;
  bool bVar7;
  long local_c40;
  ofstream os;
  allocator<char> local_a39;
  string local_a38 [8];
  string filename;
  ofstream ascFile;
  string local_818 [32];
  string local_7f8 [32];
  char *local_7d8;
  char *signature;
  string local_7c8 [32];
  stringstream local_7a8 [8];
  stringstream ss_1;
  ostream local_798 [376];
  string local_620 [32];
  stringstream local_600 [8];
  stringstream ss;
  ostream local_5f0 [376];
  undefined1 local_478 [8];
  ifstream textFile;
  undefined1 local_260 [8];
  ifstream keyFile;
  string local_58 [8];
  string plain;
  string key;
  char **argv_local;
  int argc_local;
  
  if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cout,"VerifyRSA - https://github.com/rodlie/verifyrsa"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: rsa-sign <private key> <text file>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 0;
  }
  else {
    std::__cxx11::string::string((string *)(plain.field_2._M_local_buf + 8));
    std::__cxx11::string::string(local_58);
    std::ifstream::ifstream(local_260);
    std::ifstream::ifstream(local_478);
    std::ifstream::open(local_260,argv[1],8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_600);
      psVar3 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_5f0,psVar3);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)(plain.field_2._M_local_buf + 8),local_620);
      std::__cxx11::string::~string(local_620);
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream(local_600);
    }
    std::ifstream::open(local_478,argv[2],8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) != 0) {
      std::__cxx11::stringstream::stringstream(local_7a8);
      psVar3 = (streambuf *)std::ifstream::rdbuf();
      std::ostream::operator<<(local_798,psVar3);
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=(local_58,local_7c8);
      std::__cxx11::string::~string(local_7c8);
      std::ifstream::close();
      std::__cxx11::stringstream::~stringstream(local_7a8);
    }
    uVar4 = std::__cxx11::string::empty();
    if (((uVar4 & 1) == 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      std::__cxx11::string::string(local_7f8,(string *)(plain.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_818,local_58);
      pcVar5 = (char *)VerifyRSA::sign(local_7f8,local_818);
      std::__cxx11::string::~string(local_818);
      std::__cxx11::string::~string(local_7f8);
      local_7d8 = pcVar5;
      std::ofstream::ofstream((void *)((long)&filename.field_2 + 8));
      pcVar5 = argv[2];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_a38,pcVar5,&local_a39);
      std::allocator<char>::~allocator(&local_a39);
      std::__cxx11::string::append((char *)local_a38);
      uVar6 = std::__cxx11::string::c_str();
      std::ofstream::ofstream(&local_c40,uVar6,0x10);
      bVar1 = std::ios::operator!((ios *)((long)&local_c40 + *(long *)(local_c40 + -0x18)));
      bVar7 = (bVar1 & 1) != 0;
      if (bVar7) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to write signature!");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        std::operator<<((ostream *)&local_c40,local_7d8);
      }
      argv_local._4_4_ = (uint)bVar7;
      signature._4_4_ = 1;
      std::ofstream::~ofstream(&local_c40);
      std::__cxx11::string::~string(local_a38);
      std::ofstream::~ofstream((void *)((long)&filename.field_2 + 8));
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Missing key or text.");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      signature._4_4_ = 1;
    }
    std::ifstream::~ifstream(local_478);
    std::ifstream::~ifstream(local_260);
    std::__cxx11::string::~string(local_58);
    std::__cxx11::string::~string((string *)(plain.field_2._M_local_buf + 8));
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    if (argc<3) {
        std::cout << "VerifyRSA - https://github.com/rodlie/verifyrsa" << std::endl;
        std::cout << "" << std::endl;
        std::cout << "Usage: rsa-sign <private key> <text file>" << std::endl;
        return 0;
    }

    std::string key, plain;
    std::ifstream keyFile, textFile;
    keyFile.open(argv[1]);
    if (keyFile.is_open()) {
        std::stringstream ss;
        ss << keyFile.rdbuf();
        key = ss.str();
        keyFile.close();
    }
    textFile.open(argv[2]);
    if (textFile.is_open()) {
        std::stringstream ss;
        ss << textFile.rdbuf();
        plain = ss.str();
        textFile.close();
    }

    if (key.empty() || plain.empty()) {
        std::cerr << "Missing key or text." << std::endl;
        return 1;
    }

    char* signature = VerifyRSA::sign(key, plain);
    if (sizeof(signature)<1) {
        std::cerr << "Unable to sign file!" << std::endl;
        return 1;
    }

    std::ofstream ascFile;
    std::string filename = argv[2];
    filename.append(".asc");
    std::ofstream os(filename.c_str());
    if (!os) {
        std::cerr << "Failed to write signature!" << std::endl;
        return 1;
    }
    else { os << signature; }
    return 0;
}